

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsItemFocused(void)

{
  ImGuiWindow *window;
  ImGuiContext *g;
  
  if ((GImGui->NavId == (GImGui->LastItemData).ID) && (GImGui->NavId != 0)) {
    if (((GImGui->LastItemData).ID == GImGui->CurrentWindow->ID) &&
       ((GImGui->CurrentWindow->WriteAccessed & 1U) != 0)) {
      g._7_1_ = false;
    }
    else {
      g._7_1_ = true;
    }
  }
  else {
    g._7_1_ = false;
  }
  return g._7_1_;
}

Assistant:

bool ImGui::IsItemFocused()
{
    ImGuiContext& g = *GImGui;
    if (g.NavId != g.LastItemData.ID || g.NavId == 0)
        return false;

    // Special handling for the dummy item after Begin() which represent the title bar or tab.
    // When the window is collapsed (SkipItems==true) that last item will never be overwritten so we need to detect the case.
    ImGuiWindow* window = g.CurrentWindow;
    if (g.LastItemData.ID == window->ID && window->WriteAccessed)
        return false;

    return true;
}